

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O0

optional<pbrt::SampledLight> * __thiscall
pbrt::ExhaustiveLightSampler::Sample(ExhaustiveLightSampler *this,LightSampleContext *ctx,Float u)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  float *pfVar6;
  long in_RSI;
  LightSampleContext *in_RDI;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [56];
  undefined1 extraout_var [60];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  Point3f PVar13;
  Float pdf_1;
  size_t i;
  WeightedReservoirSampler<pbrt::Light> wrs;
  uint64_t seed;
  LightBounds *in_stack_00000100;
  Float pdf;
  int index;
  Float pInfinite;
  float in_stack_00000140;
  undefined4 in_stack_fffffffffffffeb8;
  Float in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  WeightedReservoirSampler<pbrt::Light> *in_stack_fffffffffffffec8;
  WeightedReservoirSampler<pbrt::Light> *in_stack_fffffffffffffed0;
  LightSampleContext *this_00;
  ulong local_78;
  WeightedReservoirSampler<pbrt::Light> local_70;
  uint64_t local_50;
  float local_44 [3];
  float local_38;
  float local_30;
  int local_2c;
  int local_28;
  int local_24;
  float local_20;
  float local_1c;
  undefined1 auVar10 [64];
  
  auVar12 = in_ZMM1._0_16_;
  auVar8 = in_ZMM0._0_16_;
  local_1c = in_ZMM0._0_4_;
  this_00 = in_RDI;
  sVar4 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                    ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                     (in_RSI + 0x40));
  auVar8 = vcvtusi2ss_avx512f(auVar8,sVar4);
  sVar4 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                    ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                     (in_RSI + 0x40));
  bVar1 = pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
          empty((vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *)
                0x8dfef8);
  auVar12 = vcvtusi2ss_avx512f(auVar12,sVar4 + (long)(int)(uint)(((bVar1 ^ 0xffU) & 1) != 0));
  local_20 = auVar8._0_4_ / auVar12._0_4_;
  if (local_20 <= local_1c) {
    local_44[0] = (local_1c - local_20) / (1.0 - local_20);
    pfVar6 = std::min<float>(local_44,(float *)&OneMinusEpsilon);
    local_1c = *pfVar6;
    auVar9 = ZEXT464(0);
    uVar2 = FloatToBits(0.0);
    local_50 = MixBits((ulong)uVar2);
    WeightedReservoirSampler<pbrt::Light>::WeightedReservoirSampler
              (in_stack_fffffffffffffed0,(uint64_t)in_stack_fffffffffffffec8);
    local_78 = 0;
    while( true ) {
      auVar11 = auVar9._8_56_;
      sVar4 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                        ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                         (in_RSI + 0x20));
      if (sVar4 <= local_78) break;
      pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::operator[]
                ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                 (in_RSI + 0x20),local_78);
      pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
      operator[]((vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *)
                 (in_RSI + 0x60),local_78);
      PVar13 = LightSampleContext::p(this_00);
      auVar10._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar10._8_56_ = auVar11;
      vmovlpd_avx(auVar10._0_16_);
      PVar13.super_Tuple3<pbrt::Point3,_float>.z = in_stack_00000140;
      PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_ = this;
      LightBounds::Importance(in_stack_00000100,PVar13,_pdf);
      auVar9._60_4_ = 0;
      auVar9._0_60_ = extraout_var;
      auVar9 = auVar9 << 0x20;
      WeightedReservoirSampler<pbrt::Light>::Add
                (in_stack_fffffffffffffec8,
                 (Light *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
      local_78 = local_78 + 1;
    }
    iVar3 = WeightedReservoirSampler<pbrt::Light>::HasSample(&local_70);
    if (iVar3 == 0) {
      memset(in_RDI,0,0x18);
      pstd::optional<pbrt::SampledLight>::optional((optional<pbrt::SampledLight> *)in_RDI);
    }
    else {
      fVar7 = 1.0 - local_20;
      WeightedReservoirSampler<pbrt::Light>::SampleProbability(&local_70);
      WeightedReservoirSampler<pbrt::Light>::GetSample(&local_70);
      Light::Light((Light *)CONCAT44(fVar7,in_stack_fffffffffffffec0),
                   (Light *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      pstd::optional<pbrt::SampledLight>::optional
                ((optional<pbrt::SampledLight> *)CONCAT44(fVar7,in_stack_fffffffffffffec0),
                 (SampledLight *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
  }
  else {
    auVar8 = ZEXT416((uint)local_20);
    fVar7 = local_1c / local_20;
    local_1c = fVar7;
    sVar4 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                      ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                       (in_RSI + 0x40));
    auVar8 = vcvtusi2ss_avx512f(auVar8,sVar4);
    local_28 = (int)(fVar7 * auVar8._0_4_);
    sVar4 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                      ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                       (in_RSI + 0x40));
    local_2c = (int)sVar4 + -1;
    piVar5 = std::min<int>(&local_28,&local_2c);
    local_24 = *piVar5;
    fVar7 = local_20 * 1.0;
    sVar4 = pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                      ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                       (in_RSI + 0x40));
    auVar8 = vcvtusi2ss_avx512f(auVar8,sVar4);
    local_30 = fVar7 / auVar8._0_4_;
    pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::operator[]
              ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
               (in_RSI + 0x40),(long)local_24);
    Light::Light((Light *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (Light *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_38 = local_30;
    pstd::optional<pbrt::SampledLight>::optional
              ((optional<pbrt::SampledLight> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (SampledLight *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  return (optional<pbrt::SampledLight> *)this_00;
}

Assistant:

PBRT_CPU_GPU pstd::optional<SampledLight> ExhaustiveLightSampler::Sample(const LightSampleContext &ctx,
                                                            Float u) const {
    Float pInfinite = Float(infiniteLights.size()) /
                      Float(infiniteLights.size() + (!lightBounds.empty() ? 1 : 0));

    // Note: shared with BVH light sampler...
    if (u < pInfinite) {
        u /= pInfinite;
        int index = std::min<int>(u * infiniteLights.size(), infiniteLights.size() - 1);
        Float pdf = pInfinite * 1.f / infiniteLights.size();
        return SampledLight{infiniteLights[index], pdf};
    } else {
        u = std::min<Float>((u - pInfinite) / (1 - pInfinite), OneMinusEpsilon);

        uint64_t seed = MixBits(FloatToBits(u));
        WeightedReservoirSampler<Light> wrs(seed);

        for (size_t i = 0; i < boundedLights.size(); ++i)
            wrs.Add(boundedLights[i], lightBounds[i].Importance(ctx.p(), ctx.n));

        if (!wrs.HasSample())
            return {};

        Float pdf = (1.f - pInfinite) * wrs.SampleProbability();
        return SampledLight{wrs.GetSample(), pdf};
    }
}